

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_mthd.h
# Opt level: O1

void __thiscall
hwtest::pgraph::MthdVtxXy::MthdVtxXy
          (MthdVtxXy *this,TestOptions *opt,uint32_t seed,string *name,int trapbit,uint32_t cls,
          uint32_t mthd,uint32_t num,uint32_t stride,int flags)

{
  pointer pcVar1;
  
  Test::Test((Test *)this,opt,seed);
  (this->super_SingleMthdTest).super_MthdTest.trapbit = -1;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00348698;
  (this->super_SingleMthdTest).s_cls = cls;
  (this->super_SingleMthdTest).s_mthd = mthd;
  (this->super_SingleMthdTest).s_stride = stride;
  (this->super_SingleMthdTest).s_num = num;
  (this->super_SingleMthdTest).s_trapbit = trapbit;
  (this->super_SingleMthdTest).name._M_dataplus._M_p =
       (pointer)&(this->super_SingleMthdTest).name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_SingleMthdTest).name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00349d88;
  this->first = (bool)((byte)flags & 1);
  this->poly = (bool)((byte)flags >> 1 & 1);
  this->draw = (bool)((byte)flags >> 2 & 1);
  this->fract = (bool)((byte)flags >> 3 & 1);
  this->noclip = (bool)((byte)flags >> 4 & 1);
  this->ifc = (bool)((byte)flags >> 5 & 1);
  this->check = (bool)((byte)flags >> 6 & 1);
  this->tfc = (bool)((byte)flags >> 7);
  return;
}

Assistant:

MthdVtxXy(hwtest::TestOptions &opt, uint32_t seed, const std::string &name, int trapbit, uint32_t cls, uint32_t mthd, uint32_t num, uint32_t stride, int flags)
	: SingleMthdTest(opt, seed, name, trapbit, cls, mthd, num, stride) {
		first = !!(flags & VTX_FIRST);
		poly = !!(flags & VTX_POLY);
		draw = !!(flags & VTX_DRAW);
		fract = !!(flags & VTX_FRACT);
		noclip = !!(flags & VTX_NOCLIP);
		ifc = !!(flags & VTX_IFC);
		check = !!(flags & VTX_CHECK);
		tfc = !!(flags & VTX_TFC);
	}